

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  string id;
  Parser par;
  string local_180;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 local_150 [16];
  string local_140;
  Parser local_120;
  
  local_160 = local_150;
  local_158 = 0;
  local_150[0] = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1b2c + 1);
  std::endl<char,std::char_traits<char>>(poVar2);
  while( true ) {
    piVar3 = std::operator>>((istream *)&std::cin,(string *)&local_160);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::string((string *)&local_140,(string *)&local_160);
    Parser::Parser(&local_120,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    bVar1 = Parser::check(&local_120);
    if (bVar1) {
      Parser::parse(&local_120);
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1aae);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1ab8);
      Parser::get_address_abi_cxx11_(&local_180,&local_120);
      poVar2 = std::operator<<(poVar2,(string *)&local_180);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_180);
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1ace);
      Parser::get_year(&local_120);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,anon_var_dwarf_1ae4);
      Parser::get_month(&local_120);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,anon_var_dwarf_1afa);
      Parser::get_day(&local_120);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,anon_var_dwarf_1b04);
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1b0e);
      Parser::get_sex_abi_cxx11_(&local_180,&local_120);
      poVar2 = std::operator<<(poVar2,(string *)&local_180);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_180);
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1b18);
      Parser::get_animal_abi_cxx11_(&local_180,&local_120);
      poVar2 = std::operator<<(poVar2,(string *)&local_180);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_180);
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1b22);
      Parser::get_star_abi_cxx11_(&local_180,&local_120);
      poVar2 = std::operator<<(poVar2,(string *)&local_180);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_180);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1aa4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1b2c);
    std::endl<char,std::char_traits<char>>(poVar2);
    Parser::~Parser(&local_120);
  }
  std::__cxx11::string::~string((string *)&local_160);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    string id;
    cout << "请输入身份证号：" << endl;
    while (cin >> id) {
        Parser par(id);
        if (!par.check()) {
            cout << "身份证号不正确！" << endl;
        } else {
            par.parse();
            cout << "查得个人信息为：" << endl;
            cout << "地    址：" << par.get_address() << endl;
            cout << "出生日期：" << par.get_year() << "年" << par.get_month() << "月" << par.get_day() << "日" << endl;
            cout << "性    别：" << par.get_sex() << endl;
            cout << "属    相：" << par.get_animal() << endl;
            cout << "星    座：" << par.get_star() << endl;
        }
        cout << "\n请输入身份证号：" << endl;
    }
    return 0;
}